

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::Set(internalJSONNode *this,json_string *val)

{
  json_string *val_local;
  internalJSONNode *this_local;
  
  this->_type = '\x01';
  std::__cxx11::string::operator=((string *)&this->_string,(string *)val);
  shrinkString(&this->_string);
  this->_string_encoded = true;
  SetFetched(this,true);
  return;
}

Assistant:

void internalJSONNode::Set(const json_string & val) json_nothrow {
    makeNotContainer();
    _type = JSON_STRING;
    _string = val;
	shrinkString(_string);
    _string_encoded = true;
    SetFetched(true);
}